

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O0

void __thiscall HPack::FieldLookupTable::evictEntry(FieldLookupTable *this)

{
  long lVar1;
  HeaderSize HVar2;
  FieldLookupTable *in_RDI;
  long in_FS_OFFSET;
  HeaderField *field;
  size_type res;
  HeaderSize entrySize;
  key_type *__x;
  FieldLookupTable *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->nDynamic != 0) {
    if ((in_RDI->useIndex & 1U) != 0) {
      __x = (key_type *)&in_RDI->searchIndex;
      backKey(in_stack_ffffffffffffffd0);
      std::
      set<HPack::FieldLookupTable::SearchEntry,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
      ::erase((set<HPack::FieldLookupTable::SearchEntry,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
               *)in_RDI,__x);
    }
    back(in_RDI);
    HVar2 = entry_size((HeaderField *)in_RDI);
    in_RDI->dataSize = in_RDI->dataSize - HVar2.second;
    in_RDI->nDynamic = in_RDI->nDynamic - 1;
    in_RDI->end = in_RDI->end - 1;
    if (in_RDI->end == in_RDI->begin) {
      in_RDI->end = 0x10;
      in_RDI->begin = in_RDI->end;
    }
    else if ((in_RDI->end & 0xf) == 0) {
      std::
      deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
      ::pop_back((deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
                  *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FieldLookupTable::evictEntry()
{
    if (!nDynamic)
        return;

    Q_ASSERT(end != begin);

    if (useIndex) {
        const auto res = searchIndex.erase(backKey());
        Q_UNUSED(res);
        Q_ASSERT(res == 1);
    }

    const HeaderField &field = back();
    const auto entrySize = entry_size(field);
    Q_ASSERT(entrySize.first);
    Q_ASSERT(dataSize >= entrySize.second);
    dataSize -= entrySize.second;

    --nDynamic;
    --end;

    if (end == begin) {
        Q_ASSERT(chunks.size() == 1);
        end = ChunkSize;
        begin = end;
    } else if (!(end % ChunkSize)) {
        chunks.pop_back();
    }
}